

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall
jsonnet::internal::LiteralNumber::LiteralNumber(LiteralNumber *this,LiteralNumber *param_1)

{
  pointer pcVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0023fb28;
  (this->super_AST).location.file._M_dataplus._M_p =
       (pointer)&(this->super_AST).location.file.field_2;
  pcVar1 = (param_1->super_AST).location.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_AST).location,pcVar1,
             pcVar1 + (param_1->super_AST).location.file._M_string_length);
  uVar2 = (param_1->super_AST).location.begin.line;
  uVar3 = (param_1->super_AST).location.begin.column;
  uVar4 = (param_1->super_AST).location.end.column;
  (this->super_AST).location.end.line = (param_1->super_AST).location.end.line;
  (this->super_AST).location.end.column = uVar4;
  (this->super_AST).location.begin.line = uVar2;
  (this->super_AST).location.begin.column = uVar3;
  (this->super_AST).type = (param_1->super_AST).type;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&(this->super_AST).openFodder,&(param_1->super_AST).openFodder);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&(this->super_AST).freeVariables,&(param_1->super_AST).freeVariables);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralNumber_0023fe58;
  this->value = param_1->value;
  (this->originalString)._M_dataplus._M_p = (pointer)&(this->originalString).field_2;
  pcVar1 = (param_1->originalString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->originalString,pcVar1,
             pcVar1 + (param_1->originalString)._M_string_length);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }